

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O1

void __thiscall OpenMD::FluctuatingChargeLangevin::initialize(FluctuatingChargeLangevin *this)

{
  Globals *pGVar1;
  FluctuatingChargeParameters *pFVar2;
  double dVar3;
  
  FluctuatingChargePropagator::initialize(&this->super_FluctuatingChargePropagator);
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    pGVar1 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    if ((pGVar1->Dt).super_ParameterBase.empty_ == false) {
      dVar3 = (pGVar1->Dt).data_;
      this->dt_ = dVar3;
      this->dt2_ = dVar3 * 0.5;
    }
    else {
      builtin_strncpy(painCave.errMsg + 0x20," dt is not set\n",0x10);
      builtin_strncpy(painCave.errMsg + 0x10,"eLangevin Error:",0x10);
      builtin_strncpy(painCave.errMsg,"FluctuatingCharg",0x10);
      painCave.isFatal = 1;
      simError();
    }
    pFVar2 = (this->super_FluctuatingChargePropagator).fqParams_;
    if ((pFVar2->TargetTemp).super_ParameterBase.empty_ == true) {
      memcpy(&painCave,
             "You can\'t use the FluctuatingChargeLangevin propagator without a flucQ.targetTemp!\n"
             ,0x54);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      this->targetTemp_ = (pFVar2->TargetTemp).data_;
    }
    pFVar2 = (this->super_FluctuatingChargePropagator).fqParams_;
    if ((pFVar2->DragCoefficient).super_ParameterBase.empty_ == true) {
      memcpy(&painCave,
             "If you use the FluctuatingChargeLangevin\n\tpropagator, you must set flucQ.dragCoefficient .\n"
             ,0x5c);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      this->drag_ = (pFVar2->DragCoefficient).data_;
    }
  }
  dVar3 = (this->targetTemp_ * 0.0039744312 * this->drag_) / this->dt_;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  (this->forceDistribution_)._M_param._M_mean = 0.0;
  (this->forceDistribution_)._M_param._M_stddev = dVar3;
  (this->forceDistribution_)._M_saved = 0.0;
  (this->forceDistribution_)._M_saved_available = false;
  return;
}

Assistant:

void FluctuatingChargeLangevin::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeLangevin Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!fqParams_->haveTargetTemp()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "You can't use the FluctuatingChargeLangevin "
                 "propagator without a flucQ.targetTemp!\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        targetTemp_ = fqParams_->getTargetTemp();
      }

      // We must set tauThermostat.

      if (!fqParams_->haveDragCoefficient()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeLangevin\n"
                 "\tpropagator, you must set flucQ.dragCoefficient .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        drag_ = fqParams_->getDragCoefficient();
      }
    }

    RealType stdDev =
        std::sqrt(2.0 * Constants::kb * targetTemp_ * drag_ / dt_);

    forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
  }